

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void SimpleLoggerMgr::handleSegAbort(int sig)

{
  bool bVar1;
  SimpleLoggerMgr *this;
  allocator local_31;
  string local_30;
  
  this = get();
  signal(6,(__sighandler_t)this->oldSigAbortHandler);
  enableOnlyOneDisplayer(this);
  std::__cxx11::string::string((string *)&local_30,"Abort",&local_31);
  flushAllLoggers(this,1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  logStackBacktrace(this,60000);
  puts("[ABORT] Flushed all logs safely.");
  fflush(_stdout);
  bVar1 = chkExitOnCrash(this);
  if (bVar1) {
    puts("[ABORT] Exit on crash.");
    fflush(_stdout);
    exit(-1);
  }
  abort();
}

Assistant:

void SimpleLoggerMgr::handleSegAbort(int sig) {
#if defined(__linux__) || defined(__APPLE__)
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    signal(SIGABRT, mgr->oldSigAbortHandler);
    mgr->enableOnlyOneDisplayer();
    mgr->flushAllLoggers(1, "Abort");
    mgr->logStackBacktrace();

    printf("[ABORT] Flushed all logs safely.\n");
    fflush(stdout);

    if (mgr->chkExitOnCrash()) {
        printf("[ABORT] Exit on crash.\n");
        fflush(stdout);
        exit(-1);
    }

    abort();
#endif
}